

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

bool __thiscall Kernel::AppliedTerm::equalsShallow(AppliedTerm *this,AppliedTerm other)

{
  bool bVar1;
  
  if ((this->aboveVar == false) && (other.aboveVar != true)) {
LAB_005532ef:
    bVar1 = (this->term)._content == other.term._content;
  }
  else {
    bVar1 = TermList::ground(&this->term);
    if (bVar1) {
      bVar1 = TermList::ground(&other.term);
      if (bVar1) goto LAB_005532ef;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool equalsShallow(AppliedTerm other) const {
    return ((!aboveVar && !other.aboveVar) || (term.ground() && other.term.ground()))
      && term==other.term;
  }